

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteDescriptor
          (ReflectionClassGenerator *this,Printer *printer)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  string *value1;
  ulong uVar5;
  FileDescriptor *pFVar6;
  EnumDescriptor *this_00;
  Descriptor *descriptor;
  FileDescriptor *descriptor_00;
  FileDescriptor *descriptor_01;
  EnumDescriptor *descriptor_02;
  int local_dc;
  undefined1 local_d8 [4];
  int i_2;
  int local_b4;
  undefined1 local_b0 [4];
  int i_1;
  int local_8c;
  string local_88 [4];
  int i;
  string local_58;
  undefined1 local_38 [8];
  string base64;
  Printer *printer_local;
  ReflectionClassGenerator *this_local;
  
  base64.field_2._8_8_ = printer;
  value1 = FileDescriptor::name_abi_cxx11_(this->file_);
  io::Printer::Print(printer,
                     "#region Descriptor\n/// <summary>File descriptor for $file_name$</summary>\npublic static pbr::FileDescriptor Descriptor {\n  get { return descriptor; }\n}\nprivate static pbr::FileDescriptor descriptor;\n\nstatic $reflection_class_name$() {\n"
                     ,"file_name",value1,"reflection_class_name",&this->reflectionClassname_);
  io::Printer::Indent((Printer *)base64.field_2._8_8_);
  io::Printer::Print((Printer *)base64.field_2._8_8_,
                     "byte[] descriptorData = global::System.Convert.FromBase64String(\n");
  io::Printer::Indent((Printer *)base64.field_2._8_8_);
  io::Printer::Indent((Printer *)base64.field_2._8_8_);
  io::Printer::Print((Printer *)base64.field_2._8_8_,"string.Concat(\n");
  io::Printer::Indent((Printer *)base64.field_2._8_8_);
  FileDescriptorToBase64_abi_cxx11_((string *)local_38,(csharp *)this->file_,descriptor_00);
  while( true ) {
    uVar5 = std::__cxx11::string::size();
    uVar1 = base64.field_2._8_8_;
    if (uVar5 < 0x3d) break;
    std::__cxx11::string::substr((ulong)&local_58,(ulong)local_38);
    io::Printer::Print((Printer *)uVar1,"\"$base64$\",\n","base64",&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::substr((ulong)local_88,(ulong)local_38);
    std::__cxx11::string::operator=((string *)local_38,local_88);
    std::__cxx11::string::~string(local_88);
  }
  io::Printer::Print((Printer *)base64.field_2._8_8_,"\"$base64$\"));\n","base64",(string *)local_38
                    );
  io::Printer::Outdent((Printer *)base64.field_2._8_8_);
  io::Printer::Outdent((Printer *)base64.field_2._8_8_);
  io::Printer::Outdent((Printer *)base64.field_2._8_8_);
  io::Printer::Print((Printer *)base64.field_2._8_8_,
                     "descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n");
  io::Printer::Print((Printer *)base64.field_2._8_8_,"    new pbr::FileDescriptor[] { ");
  local_8c = 0;
  while( true ) {
    iVar4 = local_8c;
    iVar3 = FileDescriptor::dependency_count(this->file_);
    if (iVar3 <= iVar4) break;
    pFVar6 = FileDescriptor::dependency(this->file_,local_8c);
    bVar2 = IsDescriptorProto(pFVar6);
    uVar1 = base64.field_2._8_8_;
    if (bVar2) {
      io::Printer::Print((Printer *)base64.field_2._8_8_,
                         "pbr::FileDescriptor.DescriptorProtoFileDescriptor, ");
    }
    else {
      pFVar6 = FileDescriptor::dependency(this->file_,local_8c);
      GetReflectionClassName_abi_cxx11_((string *)local_b0,(csharp *)pFVar6,descriptor_01);
      io::Printer::Print((Printer *)uVar1,"$full_reflection_class_name$.Descriptor, ",
                         "full_reflection_class_name",(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
    }
    local_8c = local_8c + 1;
  }
  io::Printer::Print((Printer *)base64.field_2._8_8_,"},\n    new pbr::GeneratedClrTypeInfo(");
  iVar4 = FileDescriptor::enum_type_count(this->file_);
  if (iVar4 < 1) {
    io::Printer::Print((Printer *)base64.field_2._8_8_,"null, ");
  }
  else {
    io::Printer::Print((Printer *)base64.field_2._8_8_,"new[] {");
    local_b4 = 0;
    while( true ) {
      iVar4 = local_b4;
      iVar3 = FileDescriptor::enum_type_count(this->file_);
      uVar1 = base64.field_2._8_8_;
      if (iVar3 <= iVar4) break;
      this_00 = FileDescriptor::enum_type(this->file_,local_b4);
      GetClassName_abi_cxx11_((string *)local_d8,(csharp *)this_00,descriptor_02);
      io::Printer::Print((Printer *)uVar1,"typeof($type_name$), ","type_name",(string *)local_d8);
      std::__cxx11::string::~string((string *)local_d8);
      local_b4 = local_b4 + 1;
    }
    io::Printer::Print((Printer *)base64.field_2._8_8_,"}, ");
  }
  iVar4 = FileDescriptor::message_type_count(this->file_);
  if (iVar4 < 1) {
    io::Printer::Print((Printer *)base64.field_2._8_8_,"null));\n");
  }
  else {
    io::Printer::Print((Printer *)base64.field_2._8_8_,"new pbr::GeneratedClrTypeInfo[] {\n");
    io::Printer::Indent((Printer *)base64.field_2._8_8_);
    io::Printer::Indent((Printer *)base64.field_2._8_8_);
    io::Printer::Indent((Printer *)base64.field_2._8_8_);
    local_dc = 0;
    while( true ) {
      iVar4 = FileDescriptor::message_type_count(this->file_);
      if (iVar4 <= local_dc) break;
      descriptor = FileDescriptor::message_type(this->file_,local_dc);
      uVar1 = base64.field_2._8_8_;
      iVar4 = FileDescriptor::message_type_count(this->file_);
      WriteGeneratedCodeInfo(this,descriptor,(Printer *)uVar1,local_dc == iVar4 + -1);
      local_dc = local_dc + 1;
    }
    io::Printer::Outdent((Printer *)base64.field_2._8_8_);
    io::Printer::Print((Printer *)base64.field_2._8_8_,"\n}));\n");
    io::Printer::Outdent((Printer *)base64.field_2._8_8_);
    io::Printer::Outdent((Printer *)base64.field_2._8_8_);
  }
  io::Printer::Outdent((Printer *)base64.field_2._8_8_);
  io::Printer::Print((Printer *)base64.field_2._8_8_,"}\n");
  io::Printer::Print((Printer *)base64.field_2._8_8_,"#endregion\n\n");
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ReflectionClassGenerator::WriteDescriptor(io::Printer* printer) {
  printer->Print(
    "#region Descriptor\n"
    "/// <summary>File descriptor for $file_name$</summary>\n"
    "public static pbr::FileDescriptor Descriptor {\n"
    "  get { return descriptor; }\n"
    "}\n"
    "private static pbr::FileDescriptor descriptor;\n"
    "\n"
    "static $reflection_class_name$() {\n",
    "file_name", file_->name(),
    "reflection_class_name", reflectionClassname_);
  printer->Indent();
  printer->Print(
    "byte[] descriptorData = global::System.Convert.FromBase64String(\n");
  printer->Indent();
  printer->Indent();
  printer->Print("string.Concat(\n");
  printer->Indent();

  // TODO(jonskeet): Consider a C#-escaping format here instead of just Base64.
  std::string base64 = FileDescriptorToBase64(file_);
  while (base64.size() > 60) {
    printer->Print("\"$base64$\",\n", "base64", base64.substr(0, 60));
    base64 = base64.substr(60);
  }
  printer->Print("\"$base64$\"));\n", "base64", base64);
  printer->Outdent();
  printer->Outdent();
  printer->Outdent();

  // -----------------------------------------------------------------
  // Invoke InternalBuildGeneratedFileFrom() to build the file.
  printer->Print(
      "descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n");
  printer->Print("    new pbr::FileDescriptor[] { ");
  for (int i = 0; i < file_->dependency_count(); i++) {
    // descriptor.proto is special: we don't allow access to the generated code, but there's
    // a separately-exposed property to get at the file descriptor, specifically to allow this
    // kind of dependency.
    if (IsDescriptorProto(file_->dependency(i))) {
      printer->Print("pbr::FileDescriptor.DescriptorProtoFileDescriptor, ");
    } else {
      printer->Print(
      "$full_reflection_class_name$.Descriptor, ",
      "full_reflection_class_name",
      GetReflectionClassName(file_->dependency(i)));
    }
  }
  printer->Print("},\n"
      "    new pbr::GeneratedClrTypeInfo(");
  // Specify all the generated code information, recursively.
  if (file_->enum_type_count() > 0) {
      printer->Print("new[] {");
      for (int i = 0; i < file_->enum_type_count(); i++) {
          printer->Print("typeof($type_name$), ", "type_name", GetClassName(file_->enum_type(i)));
      }
      printer->Print("}, ");
  }
  else {
      printer->Print("null, ");
  }
  if (file_->message_type_count() > 0) {
      printer->Print("new pbr::GeneratedClrTypeInfo[] {\n");
      printer->Indent();
      printer->Indent();
      printer->Indent();
      for (int i = 0; i < file_->message_type_count(); i++) {
          WriteGeneratedCodeInfo(file_->message_type(i), printer, i == file_->message_type_count() - 1);
      }
      printer->Outdent();
      printer->Print("\n}));\n");
      printer->Outdent();
      printer->Outdent();
  }
  else {
      printer->Print("null));\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("#endregion\n\n");
}